

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

target_ulong
helper_precrqu_s_ob_qh_mips64(target_ulong rs,target_ulong rt,CPUMIPSState_conflict5 *env)

{
  target_ulong tVar1;
  long lVar2;
  byte *pbVar3;
  uint8_t temp [8];
  byte local_38;
  uint8_t local_37;
  uint8_t local_36;
  uint8_t local_35;
  uint8_t local_34;
  uint8_t local_33;
  uint8_t local_32;
  uint8_t local_31;
  
  local_31 = mipsdsp_sat8_reduce_precision((uint16_t)(rs >> 0x30),env);
  pbVar3 = &local_38;
  local_32 = mipsdsp_sat8_reduce_precision((uint16_t)(rs >> 0x20),env);
  local_33 = mipsdsp_sat8_reduce_precision((uint16_t)(rs >> 0x10),env);
  local_34 = mipsdsp_sat8_reduce_precision((uint16_t)rs,env);
  local_35 = mipsdsp_sat8_reduce_precision((uint16_t)(rt >> 0x30),env);
  local_36 = mipsdsp_sat8_reduce_precision((uint16_t)(rt >> 0x20),env);
  local_37 = mipsdsp_sat8_reduce_precision((uint16_t)(rt >> 0x10),env);
  local_38 = mipsdsp_sat8_reduce_precision((uint16_t)rt,env);
  tVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 8) {
    tVar1 = tVar1 | (ulong)*pbVar3 << ((byte)lVar2 & 0x3f);
    pbVar3 = pbVar3 + 1;
  }
  return tVar1;
}

Assistant:

target_ulong helper_precrqu_s_ob_qh(target_ulong rs, target_ulong rt,
                                    CPUMIPSState *env)
{
    int i;
    uint16_t rs3, rs2, rs1, rs0;
    uint16_t rt3, rt2, rt1, rt0;
    uint8_t temp[8];
    uint64_t result;

    result = 0;

    MIPSDSP_SPLIT64_16(rs, rs3, rs2, rs1, rs0);
    MIPSDSP_SPLIT64_16(rt, rt3, rt2, rt1, rt0);

    temp[7] = mipsdsp_sat8_reduce_precision(rs3, env);
    temp[6] = mipsdsp_sat8_reduce_precision(rs2, env);
    temp[5] = mipsdsp_sat8_reduce_precision(rs1, env);
    temp[4] = mipsdsp_sat8_reduce_precision(rs0, env);
    temp[3] = mipsdsp_sat8_reduce_precision(rt3, env);
    temp[2] = mipsdsp_sat8_reduce_precision(rt2, env);
    temp[1] = mipsdsp_sat8_reduce_precision(rt1, env);
    temp[0] = mipsdsp_sat8_reduce_precision(rt0, env);

    for (i = 0; i < 8; i++) {
        result |= (uint64_t)temp[i] << (8 * i);
    }

    return result;
}